

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void glfwSwapBuffers(GLFWwindow *handle)

{
  int error;
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/glfw-3.2.1/src/context.c"
                  ,0x261,"void glfwSwapBuffers(GLFWwindow *)");
  }
  if (_glfwInitialized == 0) {
    error = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x1f0) != 0) {
      (**(code **)(handle + 0x240))();
      return;
    }
    error = 0x1000a;
  }
  _glfwInputError(error,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSwapBuffers(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return;
    }

    window->context.swapBuffers(window);
}